

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

uint64_t HyperLogLog::Fnv64(uint8_t *x,size_t l)

{
  size_t sVar1;
  uint64_t uVar2;
  
  uVar2 = 0xcbf29ce484222325;
  if (l != 0) {
    sVar1 = 0;
    do {
      uVar2 = (x[sVar1] ^ uVar2) * 0x100000001b3;
      sVar1 = sVar1 + 1;
    } while (l != sVar1);
    return uVar2;
  }
  return 0xcbf29ce484222325;
}

Assistant:

uint64_t HyperLogLog::Fnv64(const uint8_t* x, size_t l)
{
    uint64_t fnv64 = 0xcbf29ce484222325ull;
    const uint64_t fnv64_prime = 0x00000100000001B3ull;

    /* Compute the FNV 64 bit hash */
    for (size_t i = 0; i < l; i++) {
        fnv64 ^= x[i];
        fnv64 *= fnv64_prime;
    }
    return fnv64;
}